

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O2

int average(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  undefined8 *puVar3;
  Allocator alloc;
  Tuple2<pbrt::Point2,_int> TVar4;
  ulong uVar5;
  long lVar6;
  Image *im;
  pointer this;
  char *msg;
  int c;
  Point2i p;
  Float FVar7;
  Float FVar8;
  atomic<bool> failed;
  char **argv_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  WrapMode2D local_300;
  WrapMode2D local_2f8;
  string filenameBase;
  vector<pbrt::Image,_std::allocator<pbrt::Image>_> avgImages;
  string avgFile;
  function<void_(long)> local_298;
  _Any_data local_278;
  code *local_268;
  code *local_260;
  Image avgImage;
  ImageMetadata local_138;
  
  avgFile._M_dataplus._M_p = (pointer)&avgFile.field_2;
  filenameBase._M_dataplus._M_p = (pointer)&filenameBase.field_2;
  avgFile._M_string_length = 0;
  filenameBase._M_string_length = 0;
  avgFile.field_2._M_local_buf[0] = '\0';
  filenameBase.field_2._M_local_buf[0] = '\0';
  argv_local = argv;
  while (*argv_local != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&avgImage,"outfile",(allocator<char> *)&local_138);
    local_278._M_unused._M_object = (void *)0x0;
    local_278._8_8_ = 0;
    local_260 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:574:24)>
                ::_M_invoke;
    local_268 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:574:24)>
                ::_M_manager;
    bVar1 = pbrt::ParseArg<std::__cxx11::string*>
                      (&argv_local,(string *)&avgImage,&avgFile,
                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)&local_278);
    std::_Function_base::~_Function_base((_Function_base *)&local_278);
    std::__cxx11::string::~string((string *)&avgImage);
    if (!bVar1) {
      if ((filenameBase._M_string_length != 0) || (**argv_local == '-')) {
        usage("average","%s: unknown argument");
      }
      std::__cxx11::string::assign((char *)&filenameBase);
      argv_local = argv_local + 1;
    }
  }
  if (filenameBase._M_string_length == 0) {
    msg = "must provide base filename.";
  }
  else {
    if (avgFile._M_string_length != 0) {
      pbrt::MatchingFilenames(&filenames,&filenameBase);
      if (filenames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          filenames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        fprintf(_stderr,"%s: no matching filenames!\n",filenameBase._M_dataplus._M_p);
        iVar2 = 1;
      }
      else {
        iVar2 = pbrt::MaxThreadIndex();
        std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::vector
                  (&avgImages,(long)iVar2,(allocator_type *)&avgImage);
        failed._M_base._M_i = (__atomic_base<bool>)false;
        local_298 = (function<void_(long)>)ZEXT1632(ZEXT816(0) << 0x40);
        puVar3 = (undefined8 *)operator_new(0x18);
        *puVar3 = &filenames;
        puVar3[1] = &avgImages;
        puVar3[2] = &failed;
        local_298.super__Function_base._M_functor._M_unused._M_object = puVar3;
        local_298.super__Function_base._M_manager =
             std::
             _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:603:38)>
             ::_M_manager;
        local_298._M_invoker =
             std::
             _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:603:38)>
             ::_M_invoke;
        pbrt::ParallelFor(0,(long)filenames.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)filenames.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5,&local_298);
        std::_Function_base::~_Function_base(&local_298.super__Function_base);
        if (((byte)failed._M_base._M_i & 1) == 0) {
          alloc.memoryResource = pstd::pmr::new_delete_resource();
          pbrt::Image::Image(&avgImage,alloc);
          for (this = avgImages.super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
                      _M_impl.super__Vector_impl_data._M_start;
              this != avgImages.super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
                      _M_impl.super__Vector_impl_data._M_finish; this = this + 1) {
            if ((this->resolution).super_Tuple2<pbrt::Point2,_int> != (Tuple2<pbrt::Point2,_int>)0x0
               ) {
              if (avgImage.resolution.super_Tuple2<pbrt::Point2,_int> ==
                  (Tuple2<pbrt::Point2,_int>)0x0) {
                pbrt::Image::operator=(&avgImage,this);
              }
              else {
                TVar4 = avgImage.resolution.super_Tuple2<pbrt::Point2,_int>;
                for (lVar6 = 0; lVar6 < (long)TVar4 >> 0x20; lVar6 = lVar6 + 1) {
                  for (uVar5 = 0; (long)uVar5 < (long)TVar4.x; uVar5 = uVar5 + 1) {
                    p.super_Tuple2<pbrt::Point2,_int> =
                         (Tuple2<pbrt::Point2,_int>)(lVar6 << 0x20 | uVar5);
                    for (iVar2 = 0; iVar2 < (int)avgImage.channelNames.nStored; iVar2 = iVar2 + 1) {
                      pbrt::WrapMode2D::WrapMode2D(&local_2f8,Clamp);
                      FVar7 = pbrt::Image::GetChannel(this,p,iVar2,local_2f8);
                      if (ABS(FVar7) != INFINITY) {
                        pbrt::WrapMode2D::WrapMode2D(&local_300,Clamp);
                        FVar8 = pbrt::Image::GetChannel(&avgImage,p,iVar2,local_300);
                        pbrt::Image::SetChannel(&avgImage,p,iVar2,FVar8 + FVar7);
                      }
                    }
                    TVar4 = avgImage.resolution.super_Tuple2<pbrt::Point2,_int>;
                  }
                }
              }
            }
          }
          local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header;
          local_138.colorSpace.optionalValue =
               (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                )0x0;
          local_138.colorSpace.set = false;
          local_138.colorSpace._9_7_ = 0;
          local_138.stringVectors._M_t._M_impl._0_8_ = 0;
          local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          local_138.NDCFromWorld.optionalValue._52_8_ = 0;
          local_138.NDCFromWorld._60_8_ = 0;
          local_138.pixelBounds.optionalValue._0_8_ = 0;
          local_138.pixelBounds.optionalValue._8_8_ = 0;
          local_138._160_8_ = 0;
          local_138.fullResolution._4_8_ = 0;
          local_138.samplesPerPixel.optionalValue =
               (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
          local_138.samplesPerPixel.set = false;
          local_138.samplesPerPixel._5_3_ = 0;
          local_138.MSE.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          local_138.MSE.set = false;
          local_138.MSE._5_3_ = 0;
          local_138.cameraFromWorld.optionalValue._56_8_ = 0;
          local_138._72_8_ = 0;
          local_138.NDCFromWorld.optionalValue._4_8_ = 0;
          local_138.NDCFromWorld.optionalValue._12_8_ = 0;
          local_138.NDCFromWorld.optionalValue._20_8_ = 0;
          local_138.NDCFromWorld.optionalValue._28_8_ = 0;
          local_138.NDCFromWorld.optionalValue._36_8_ = 0;
          local_138.NDCFromWorld.optionalValue._44_8_ = 0;
          local_138.renderTimeSeconds.optionalValue =
               (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          local_138.renderTimeSeconds.set = false;
          local_138.renderTimeSeconds._5_3_ = 0;
          local_138.cameraFromWorld.optionalValue._0_8_ = 0;
          local_138.cameraFromWorld.optionalValue._8_8_ = 0;
          local_138.cameraFromWorld.optionalValue._16_8_ = 0;
          local_138.cameraFromWorld.optionalValue._24_8_ = 0;
          local_138.cameraFromWorld.optionalValue._32_8_ = 0;
          local_138.cameraFromWorld.optionalValue._40_8_ = 0;
          local_138.cameraFromWorld.optionalValue._48_8_ = 0;
          local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          bVar1 = pbrt::Image::Write(&avgImage,&avgFile,&local_138);
          if (!bVar1) {
            pbrt::LogFatal<char_const(&)[24]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp"
                       ,0x28a,"Check failed: %s",(char (*) [24])"avgImage.Write(avgFile)");
          }
          pbrt::ImageMetadata::~ImageMetadata(&local_138);
          pbrt::Image::~Image(&avgImage);
          iVar2 = 0;
        }
        else {
          iVar2 = 1;
        }
        std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::~vector(&avgImages);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&filenames);
      std::__cxx11::string::~string((string *)&filenameBase);
      std::__cxx11::string::~string((string *)&avgFile);
      return iVar2;
    }
    msg = "must provide --outfile.";
  }
  usage("average",msg);
}

Assistant:

int average(int argc, char *argv[]) {
    std::string avgFile, filenameBase;

    while (*argv != nullptr) {
        auto onError = [](const std::string &err) {
            usage("average", "%s", err.c_str());
            exit(1);
        };

        if (ParseArg(&argv, "outfile", &avgFile, onError)) {
            // success
        } else if (filenameBase.empty() && argv[0][0] != '-') {
            filenameBase = *argv;
            ++argv;
        } else
            usage("average", "%s: unknown argument", *argv);
    }

    if (filenameBase.empty())
        usage("average", "must provide base filename.");
    if (avgFile.empty())
        usage("average", "must provide --outfile.");

    std::vector<std::string> filenames = MatchingFilenames(filenameBase);
    if (filenames.empty()) {
        fprintf(stderr, "%s: no matching filenames!\n", filenameBase.c_str());
        return 1;
    }

    // Compute average image
    std::vector<Image> avgImages(MaxThreadIndex());
    std::atomic<bool> failed{false};

    ParallelFor(0, filenames.size(), [&](size_t i) {
        ImageAndMetadata imRead = Image::Read(filenames[i]);
        Image &im = imRead.image;

        Image &avg = avgImages[ThreadIndex];
        if (avg.Resolution() == Point2i(0, 0))
            avg = Image(PixelFormat::Float, im.Resolution(), im.ChannelNames());
        else if (!checkImageCompatibility(filenames[i], im, filenames[0], avg)) {
            failed = true;
            return;
        }

        for (int y = 0; y < avg.Resolution().y; ++y)
            for (int x = 0; x < avg.Resolution().x; ++x)
                for (int c = 0; c < avg.NChannels(); ++c) {
                    Float v = im.GetChannel({x, y}, c) / filenames.size();
                    if (std::isnan(v))
                        LOG_FATAL("NAN Pixel at %s in %s", Point2f(x, y), filenames[i]);
                    if (std::isinf(v))
                        v = 0;
                    avg.SetChannel({x, y}, c, avg.GetChannel({x, y}, c) + v);
                }
    });

    if (failed)
        return 1;

    // Average per-thread average images
    Image avgImage;
    for (const Image &im : avgImages) {
        if (im.Resolution() == Point2i(0, 0))
            continue;
        else if (avgImage.Resolution() == Point2i(0, 0)) {
            // First valid one
            avgImage = im;
        } else {
            for (int y = 0; y < avgImage.Resolution().y; ++y)
                for (int x = 0; x < avgImage.Resolution().x; ++x)
                    for (int c = 0; c < avgImage.NChannels(); ++c) {
                        Float v = im.GetChannel({x, y}, c);
                        if (!std::isinf(v))
                            avgImage.SetChannel({x, y}, c,
                                                avgImage.GetChannel({x, y}, c) + v);
                    }
        }
    }

    CHECK(avgImage.Write(avgFile));

    return 0;
}